

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void export_token_to_json
               (DString *out,simple_token *t,char *source,int lev,stack *s,_Bool array_out)

{
  char cVar1;
  DString *out_00;
  char *appendedString;
  simple_token *local_58;
  simple_token *c;
  char *text;
  int count;
  DString *header;
  _Bool array_out_local;
  stack *s_local;
  int lev_local;
  char *source_local;
  simple_token *t_local;
  DString *out_local;
  
  text._4_4_ = 0;
  if (t != (simple_token *)0x0) {
    switch(t->type) {
    case 0:
      d_string_append_c_array(out,"[\n",2);
      export_token_tree_to_json(out,t->child,source,lev + 1,s,array_out);
      d_string_append_c_array(out,"]\n",2);
      break;
    case 1:
    case 5:
    case 7:
      d_string_append_c_array(out,source + t->start,t->len);
      break;
    case 2:
      cVar1 = source[t->start];
      if (cVar1 == '\b') {
        d_string_append_c_array(out,"\\b",2);
      }
      else if (cVar1 == '\t') {
        d_string_append_c_array(out,"\\t",2);
      }
      else if (cVar1 == '\n') {
        d_string_append_c_array(out,"\\n",2);
      }
      else if (cVar1 == '\f') {
        d_string_append_c_array(out,"\\f",2);
      }
      else if (cVar1 == '\r') {
        d_string_append_c_array(out,"\\r",2);
      }
      else if (cVar1 == '\"') {
        d_string_append_c_array(out,"\\\"",2);
      }
      else if (cVar1 == '\\') {
        d_string_append_c_array(out,"\\\\",2);
      }
      break;
    case 3:
      if ((source[t->start] == '\n') || (source[t->start] == '\r')) {
        d_string_append_c_array(out,"\\n",2);
      }
      break;
    default:
      fprintf(_stderr,"Error parsing token type %d\n",(ulong)t->type);
      break;
    case 6:
      d_string_append_c_array(out,"\\\"",2);
      break;
    case 100:
      for (local_58 = t->child; local_58 != (simple_token *)0x0; local_58 = local_58->next) {
        out_00 = d_string_new("");
        export_token_tree_to_json(out_00,local_58->child,source,0,s,array_out);
        stack_push(s,out_00->str);
        d_string_free(out_00,false);
      }
      if (!array_out) {
        return;
      }
    case 0x65:
      indent(out,lev);
      if (array_out) {
        d_string_append_c_array(out,"[\n",2);
      }
      else {
        d_string_append_c_array(out,"{\n",2);
      }
      for (local_58 = t->child; local_58 != (simple_token *)0x0; local_58 = local_58->next) {
        indent(out,lev + 1);
        if (!array_out) {
          d_string_append_c_array(out,"\"",1);
          appendedString = (char *)stack_peek_index(s,(long)text._4_4_);
          d_string_append(out,appendedString);
          d_string_append_c_array(out,"\": ",3);
        }
        export_token_to_json(out,local_58,source,lev,s,array_out);
        text._4_4_ = text._4_4_ + 1;
      }
      indent(out,lev);
      if (array_out) {
        d_string_append_c_array(out,"]",1);
      }
      else {
        d_string_append_c_array(out,"}",1);
      }
      if ((t->next == (simple_token *)0x0) || (t->next->type != 0x65)) {
        d_string_append_c_array(out,"\n",1);
      }
      else {
        d_string_append_c_array(out,",\n",2);
      }
      break;
    case 0x66:
      d_string_append_c_array(out,"\"",1);
      export_token_tree_to_json(out,t->child,source,lev,s,array_out);
      d_string_append_c_array(out,"\"",1);
      if ((t->next == (simple_token *)0x0) || ((t->next->type != 0x66 && (t->next->type != 0x67))))
      {
        d_string_append_c_array(out,"\n",1);
      }
      else {
        d_string_append_c_array(out,",\n",2);
      }
      break;
    case 0x67:
      export_token_tree_to_json(out,t->child,source,lev,s,array_out);
      if ((t->next == (simple_token *)0x0) || ((t->next->type != 0x66 && (t->next->type != 0x67))))
      {
        d_string_append_c_array(out,"\n",1);
      }
      else {
        d_string_append_c_array(out,",\n",2);
      }
      break;
    case 0x68:
    }
  }
  return;
}

Assistant:

void export_token_to_json(DString * out, simple_token * t, const char * source, int lev, stack * s, bool array_out) {
	DString * header;
	int count = 0;
	char * text;
	simple_token * c;

	if (t) {
		switch (t->type) {
			case 0:
				print_const("[\n");
				export_token_tree_to_json(out, t->child, source, lev + 1, s, array_out);
				print_const("]\n");
				break;

			case TDP_HEADER:
				c = t->child;

				while (c) {
					header = d_string_new("");
					export_token_tree_to_json(header, c->child, source, 0, s, array_out);
					stack_push(s, header->str);
					d_string_free(header, false);
					c = c->next;
				}

				if (!array_out) {
					break;
				}

			case TDP_RECORD:
				indent(out, lev);

				if (array_out) {
					print_const("[\n");
				} else {
					print_const("{\n");
				}

				c = t->child;

				while (c) {
					indent(out, lev + 1);

					if (!array_out) {
						print_const("\"");
						text = stack_peek_index(s, count);
						print(text);
						print_const("\": ");
					}

					export_token_to_json(out, c, source, lev, s, array_out);

					count++;
					c = c->next;
				}

				indent(out, lev);

				if (array_out) {
					print_const("]");
				} else {
					print_const("}");
				}

				if (t->next && t->next->type == TDP_RECORD) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD_NUMERIC:
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD:
				print_const("\"");
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);
				print_const("\"");

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TEXT_PLAIN:
			case TEXT_NUMERIC:
			case FIELD_DELIMITER:
				print_token(t);
				break;

			case RECORD_DELIMITER:
				switch (source[t->start]) {
					case '\n':
					case '\r':
						print_const("\\n");
						break;
				}

				break;

			case NEEDS_ESCAPE:
				switch (source[t->start]) {
					case '\b':
						print_const("\\b");
						break;

					case '\f':
						print_const("\\f");
						break;

					case '\n':
						print_const("\\n");
						break;

					case '\r':
						print_const("\\r");
						break;

					case '\t':
						print_const("\\t");
						break;

					case '\"':
						print_const("\\\"");
						break;

					case '\\':
						print_const("\\\\");
						break;

				}

				break;

			case TDP_EMPTY_STRING:
				break;

			case ESCAPED_ESCAPE:
				// TODO: Customize
				print_const("\\\"");
				break;

			default:
				fprintf(stderr, "Error parsing token type %d\n", t->type);
				break;
		}
	}
}